

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

void obj_chain(menulist *menu,char *src,obj *chain,long *total_count,long *total_size)

{
  nh_menuitem *pnVar1;
  nh_menuitem *_item_;
  long size;
  long count;
  char buf [256];
  long *total_size_local;
  long *total_count_local;
  obj *chain_local;
  char *src_local;
  menulist *menu_local;
  
  size = 0;
  _item_ = (nh_menuitem *)0x0;
  count_obj(chain,&size,(long *)&_item_,'\x01','\0');
  *total_count = size + *total_count;
  *total_size = (long)(_item_->caption + *total_size + -8);
  sprintf((char *)&count,"%-18s %4ld  %6ld",src,size,_item_);
  if (menu->size <= menu->icount) {
    menu->size = menu->size << 1;
    pnVar1 = (nh_menuitem *)realloc(menu->items,(long)menu->size * 0x10c);
    menu->items = pnVar1;
  }
  pnVar1 = menu->items + menu->icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,(char *)&count);
  menu->icount = menu->icount + 1;
  return;
}

Assistant:

static void obj_chain(struct menulist *menu, const char *src, struct obj *chain,
		      long *total_count, long *total_size)
{
	char buf[BUFSZ];
	long count = 0, size = 0;

	count_obj(chain, &count, &size, TRUE, FALSE);
	*total_count += count;
	*total_size += size;
	sprintf(buf, template, src, count, size);
	add_menutext(menu, buf);
}